

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O1

ze_result_t driver::zesDriverGet(uint32_t *pCount,zes_driver_handle_t *phDrivers)

{
  ze_result_t zVar1;
  ulong uVar2;
  
  if (DAT_0010eab0 != (code *)0x0) {
    zVar1 = (*DAT_0010eab0)();
    return zVar1;
  }
  if (phDrivers != (zes_driver_handle_t *)0x0) {
    uVar2 = 0;
    do {
      if (*pCount <= uVar2) {
        return ZE_RESULT_SUCCESS;
      }
      context_t::get()::count = context_t::get()::count + 1;
      phDrivers[uVar2] = context_t::get()::count;
      uVar2 = uVar2 + 1;
    } while (phDrivers != (zes_driver_handle_t *)0x0);
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGet(
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sysman driver instances.
                                                        ///< if count is zero, then the loader shall update the value with the
                                                        ///< total number of sysman drivers available.
                                                        ///< if count is greater than the number of sysman drivers available, then
                                                        ///< the loader shall update the value with the correct number of sysman
                                                        ///< drivers available.
        zes_driver_handle_t* phDrivers                  ///< [in,out][optional][range(0, *pCount)] array of sysman driver instance handles.
                                                        ///< if count is less than the number of sysman drivers available, then the
                                                        ///< loader shall only retrieve that number of sysman drivers.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGet = context.zesDdiTable.Driver.pfnGet;
        if( nullptr != pfnGet )
        {
            result = pfnGet( pCount, phDrivers );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phDrivers ) && ( i < *pCount ); ++i )
                phDrivers[ i ] = reinterpret_cast<zes_driver_handle_t>( context.get() );

        }

        return result;
    }